

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int run_using_server_starter(char *h2o_cmd,char *config_file)

{
  char *pcVar1;
  FILE *__stream;
  char **__argv;
  int *piVar2;
  char *pcVar3;
  char **args;
  char *config_file_local;
  char *h2o_cmd_local;
  
  __argv = build_server_starter_argv(h2o_cmd,config_file);
  setenv("H2O_VIA_MASTER","",1);
  execvp(*__argv,__argv);
  __stream = _stderr;
  pcVar1 = *__argv;
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  fprintf(__stream,"failed to spawn %s:%s\n",pcVar1,pcVar3);
  return 0x4e;
}

Assistant:

static int run_using_server_starter(const char *h2o_cmd, const char *config_file)
{
    char **args = build_server_starter_argv(h2o_cmd, config_file);
    setenv("H2O_VIA_MASTER", "", 1);
    execvp(args[0], args);
    fprintf(stderr, "failed to spawn %s:%s\n", args[0], strerror(errno));
    return EX_CONFIG;
}